

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O2

VarValue *
deqp::gles31::Functional::getSamplerFillValue(VarValue *__return_storage_ptr__,VarValue *sampler)

{
  int i;
  DataType DVar1;
  long lVar2;
  
  DVar1 = getSamplerLookupReturnType(sampler->type);
  __return_storage_ptr__->type = DVar1;
  if (DVar1 == TYPE_FLOAT) {
    (__return_storage_ptr__->val).floatV[0] = (sampler->val).floatV[1];
  }
  else if (DVar1 == TYPE_FLOAT_VEC4) {
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      *(undefined4 *)((long)&__return_storage_ptr__->val + lVar2 * 4) =
           *(undefined4 *)((long)&sampler->val + lVar2 * 4 + 4);
    }
  }
  else if (DVar1 == TYPE_UINT_VEC4) {
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      *(undefined4 *)((long)&__return_storage_ptr__->val + lVar2 * 4) =
           *(undefined4 *)((long)&sampler->val + lVar2 * 4 + 4);
    }
  }
  else if (DVar1 == TYPE_INT_VEC4) {
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      *(undefined4 *)((long)&__return_storage_ptr__->val + lVar2 * 4) =
           *(undefined4 *)((long)&sampler->val + lVar2 * 4 + 4);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static VarValue getSamplerFillValue (const VarValue& sampler)
{
	DE_ASSERT(glu::isDataTypeSampler(sampler.type));

	VarValue result;
	result.type = getSamplerLookupReturnType(sampler.type);

	switch (result.type)
	{
		case glu::TYPE_FLOAT_VEC4:
			for (int i = 0; i < 4; i++)
				result.val.floatV[i] = sampler.val.samplerV.fillColor.floatV[i];
			break;
		case glu::TYPE_UINT_VEC4:
			for (int i = 0; i < 4; i++)
				result.val.uintV[i] = sampler.val.samplerV.fillColor.uintV[i];
			break;
		case glu::TYPE_INT_VEC4:
			for (int i = 0; i < 4; i++)
				result.val.intV[i] = sampler.val.samplerV.fillColor.intV[i];
			break;
		case glu::TYPE_FLOAT:
			result.val.floatV[0] = sampler.val.samplerV.fillColor.floatV[0];
			break;
		default:
			DE_ASSERT(false);
	}

	return result;
}